

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall glslang::AccessChainTraverser::AccessChainTraverser(AccessChainTraverser *this)

{
  pool_allocator<char> local_18;
  AccessChainTraverser *local_10;
  AccessChainTraverser *this_local;
  
  local_10 = this;
  TIntermTraverser::TIntermTraverser(&this->super_TIntermTraverser,false,false,true,false);
  (this->super_TIntermTraverser)._vptr_TIntermTraverser =
       (_func_int **)&PTR__AccessChainTraverser_010dff40;
  pool_allocator<char>::pool_allocator(&local_18);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&this->path,
             "",&local_18);
  this->topLevelStorageQualifier = EvqLast;
  return;
}

Assistant:

AccessChainTraverser() : TIntermTraverser(false, false, true)
    {}